

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O3

Fields * trieste::wf::ops::operator*(Fields *__return_storage_ptr__,Field *fst,Field *snd)

{
  void *p;
  long lVar1;
  initializer_list<trieste::wf::Field> __l;
  long alStack_70 [2];
  allocator_type local_59;
  Field local_58;
  TokenDef *local_38;
  vector<trieste::Token,_std::allocator<trieste::Token>_> local_30;
  
  local_58.name.def = (fst->name).def;
  alStack_70[0] = 0x14c7a2;
  CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&local_58.choice.types,&(fst->choice).types);
  local_38 = (snd->name).def;
  alStack_70[0] = 0x14c7ba;
  CLI::std::vector<trieste::Token,_std::allocator<trieste::Token>_>::vector
            (&local_30,&(snd->choice).types);
  alStack_70[0] = 0x14c7d1;
  __l._M_len = 2;
  __l._M_array = &local_58;
  CLI::std::vector<trieste::wf::Field,_std::allocator<trieste::wf::Field>_>::vector
            (&__return_storage_ptr__->fields,__l,&local_59);
  (__return_storage_ptr__->binding).def = (TokenDef *)Invalid;
  lVar1 = 0x40;
  do {
    p = *(void **)((long)alStack_70 + lVar1);
    if (p != (void *)0x0) {
      alStack_70[0] = 0x14c7f9;
      operator_delete(p,*(long *)(&stack0xffffffffffffffa0 + lVar1) - (long)p);
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != 0);
  return __return_storage_ptr__;
}

Assistant:

inline Fields operator*(Field&& fst, const Field& snd)
      {
        return Fields{std::vector<Field>{fst, snd}, Invalid};
      }